

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BitSelectSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::BitSelectSyntax,slang::syntax::BitSelectSyntax_const&>
          (BumpAllocator *this,BitSelectSyntax *args)

{
  SyntaxNode *pSVar1;
  ExpressionSyntax *pEVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  BitSelectSyntax *pBVar5;
  
  pBVar5 = (BitSelectSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BitSelectSyntax *)this->endPtr < pBVar5 + 1) {
    pBVar5 = (BitSelectSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pBVar5 + 1);
  }
  SVar3 = (args->super_SelectorSyntax).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(args->super_SelectorSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SelectorSyntax).super_SyntaxNode.parent;
  pEVar2 = (args->expr).ptr;
  (pBVar5->super_SelectorSyntax).super_SyntaxNode.previewNode =
       (args->super_SelectorSyntax).super_SyntaxNode.previewNode;
  (pBVar5->expr).ptr = pEVar2;
  (pBVar5->super_SelectorSyntax).super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pBVar5->super_SelectorSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pBVar5->super_SelectorSyntax).super_SyntaxNode.parent = pSVar1;
  return pBVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }